

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<int,_int,_2U>::insert
          (IntervalMap<int,_int,_2U> *this,int left,int right,int *value,allocator_type *alloc)

{
  uint32_t uVar1;
  EVP_PKEY_CTX *ctx;
  iterator it;
  const_iterator local_70;
  
  if ((this->height == 0) && (this->rootSize != 3)) {
    local_70.map = (IntervalMap<int,_int,_2U> *)CONCAT44(right,left);
    uVar1 = IntervalMapDetails::
            NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_3U,_true>_>::find
                      ((NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_3U,_true>_> *)
                       this,this->rootSize,(interval<int> *)&local_70);
    local_70.map = (IntervalMap<int,_int,_2U> *)CONCAT44(right,left);
    uVar1 = IntervalMapDetails::LeafNode<int,_int,_3U,_true>::insertFrom
                      ((LeafNode<int,_int,_3U,_true> *)this,uVar1,this->rootSize,
                       (interval<int> *)&local_70,value);
    this->rootSize = uVar1;
  }
  else {
    local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
         (pointer)local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                  firstElement;
    local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
    local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.cap = 2;
    local_70.map = this;
    const_iterator::setToFind(&local_70,left,right);
    ctx = (EVP_PKEY_CTX *)(ulong)(uint)left;
    iterator::insert((iterator *)&local_70,left,right,value,alloc);
    SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
              ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_70.path,ctx);
  }
  return;
}

Assistant:

void insert(TKey left, TKey right, const TValue& value, allocator_type& alloc) {
        if (isFlat() && rootSize != RootLeaf::Capacity) {
            uint32_t i = rootLeaf.find(rootSize, {left, right});
            rootSize = rootLeaf.insertFrom(i, rootSize, {left, right}, value);
        }
        else {
            iterator it(*this);
            it.setToFind(left, right);
            it.insert(left, right, value, alloc);
        }
    }